

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-gguf.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  undefined1 auVar1 [16];
  ggml_backend_t pgVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  int *piVar7;
  long lVar8;
  pair<int,_int> pVar9;
  ulong uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  FILE *__s;
  size_t sVar13;
  gguf_context *pgVar14;
  long lVar15;
  size_type __n;
  size_type sVar16;
  ggml_backend_t backend;
  undefined8 *puVar17;
  char *pcVar18;
  uint uVar19;
  random_gguf_context_result result;
  random_device rd;
  undefined1 local_1468 [16];
  ggml_backend_t local_1458;
  undefined2 local_1444;
  allocator<char> local_1442;
  allocator_type local_1441;
  ggml_backend_t local_1440;
  ulong local_1438;
  ggml_backend_t local_1430;
  ggml_backend_t local_1428;
  long local_1420;
  ggml_backend_t local_1418;
  pair<int,_int> local_1410;
  undefined8 local_1408;
  uint local_13fc;
  ulong local_13f8;
  undefined8 local_13f0;
  FILE *local_13e8;
  long local_13e0;
  gguf_context *local_13d8 [2];
  long local_13c8 [2];
  random_device local_13b8;
  
  if (argc < 3) {
    std::random_device::random_device(&local_13b8);
    if (argc == 2) {
      std::__cxx11::string::string<std::allocator<char>>((string *)local_13d8,argv[1],&local_1442);
      pgVar14 = local_13d8[0];
      piVar7 = __errno_location();
      iVar5 = *piVar7;
      *piVar7 = 0;
      lVar8 = strtol((char *)pgVar14,(char **)local_1468,10);
      if ((gguf_context *)local_1468._0_8_ == pgVar14) {
        std::__throw_invalid_argument("stoi");
LAB_0010428f:
        uVar11 = std::__throw_out_of_range("stoi");
        std::random_device::_M_fini();
        _Unwind_Resume(uVar11);
      }
      local_1420 = lVar8;
      if (((int)lVar8 != lVar8) || (*piVar7 == 0x22)) goto LAB_0010428f;
      if (*piVar7 == 0) {
        *piVar7 = iVar5;
      }
    }
    else {
      local_1420 = std::random_device::_M_getval();
    }
    if ((argc == 2) && (local_13d8[0] != (gguf_context *)local_13c8)) {
      operator_delete(local_13d8[0],local_13c8[0] + 1);
    }
    ggml_backend_dev_count();
    fputc(10,_stderr);
    uVar19 = (uint)local_1420;
    pVar9 = test_handcrafted_file(uVar19);
    local_1438 = (ulong)pVar9 >> 0x20;
    local_13fc = uVar19 + 1;
    local_13f8 = 0;
    while (uVar10 = ggml_backend_dev_count(), local_13f8 < uVar10) {
      local_1410 = pVar9;
      local_1418 = (ggml_backend_t)ggml_backend_dev_get();
      local_1444 = 1;
      lVar8 = 0;
      do {
        local_13e0 = lVar8;
        bVar4 = *(bool *)((long)&local_1444 + lVar8);
        local_1428 = (ggml_backend_t)ggml_backend_dev_init(local_1418,0);
        uVar11 = ggml_backend_dev_description(local_1418);
        uVar12 = ggml_backend_name(local_1428);
        pcVar18 = "no";
        if (bVar4 != false) {
          pcVar18 = "yes";
        }
        printf("%s: device=%s, backend=%s, only_meta=%s\n","test_roundtrip",uVar11,uVar12,pcVar18);
        get_random_gguf_context
                  ((random_gguf_context_result *)local_1468,local_1428,(uint)local_1420);
        uVar11 = local_1468._0_8_;
        local_1430 = (ggml_backend_t)local_1468._8_8_;
        local_1440 = local_1458;
        __s = tmpfile();
        if (__s == (FILE *)0x0) {
          ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/tests/test-gguf.cpp"
                     ,0x446,"GGML_ASSERT(%s) failed","file");
        }
        local_1468._0_8_ = (gguf_context *)0x0;
        local_1468._8_8_ = (ggml_backend_t)0x0;
        local_1458 = (ggml_backend_t)0x0;
        gguf_write_to_buf((gguf_context *)uVar11,(vector *)local_1468,bVar4);
        sVar13 = fwrite((void *)local_1468._0_8_,1,local_1468._8_8_ - local_1468._0_8_,__s);
        if (sVar13 != local_1468._8_8_ - local_1468._0_8_) {
          ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/tests/test-gguf.cpp"
                     ,0x44c,"GGML_ASSERT(%s) failed",
                     "fwrite(buf.data(), 1, buf.size(), file) == buf.size()");
        }
        rewind(__s);
        if ((gguf_context *)local_1468._0_8_ != (gguf_context *)0x0) {
          operator_delete((void *)local_1468._0_8_,(long)local_1458 - local_1468._0_8_);
        }
        local_1408 = 0;
        puVar17 = &local_1408;
        if (bVar4 != false) {
          puVar17 = (undefined8 *)0x0;
        }
        auVar1._8_8_ = 0;
        auVar1._0_8_ = puVar17;
        local_13e8 = __s;
        pgVar14 = (gguf_context *)gguf_init_from_file_impl(__s,(gguf_init_params)(auVar1 << 0x40));
        printf("%s: same_version: ","test_roundtrip");
        iVar5 = gguf_get_version(uVar11);
        iVar6 = gguf_get_version(pgVar14);
        pcVar18 = "\x1b[1;31mFAIL\x1b[0m";
        if (iVar5 == iVar6) {
          pcVar18 = "\x1b[1;32mOK\x1b[0m";
        }
        puts(pcVar18);
        printf("%s: same_n_kv: ","test_roundtrip");
        lVar8 = gguf_get_n_kv(uVar11);
        lVar15 = gguf_get_n_kv(pgVar14);
        if (lVar8 == lVar15) {
          puts("\x1b[1;32mOK\x1b[0m");
          uVar19 = (iVar5 == iVar6) + 1;
        }
        else {
          uVar19 = (uint)(iVar5 == iVar6);
          puts("\x1b[1;31mFAIL\x1b[0m");
        }
        printf("%s: same_n_tensors: ","test_roundtrip");
        lVar8 = gguf_get_n_tensors(uVar11);
        lVar15 = gguf_get_n_tensors(pgVar14);
        if (lVar8 == lVar15) {
          puts("\x1b[1;32mOK\x1b[0m");
          uVar19 = uVar19 + 1;
        }
        else {
          puts("\x1b[1;31mFAIL\x1b[0m");
        }
        printf("%s: all_orig_kv_in_read: ","test_roundtrip");
        bVar3 = all_kv_in_other((gguf_context *)uVar11,pgVar14);
        if (bVar3) {
          puts("\x1b[1;32mOK\x1b[0m");
          uVar19 = uVar19 + 1;
        }
        else {
          puts("\x1b[1;31mFAIL\x1b[0m");
        }
        printf("%s: all_read_kv_in_orig: ","test_roundtrip");
        bVar3 = all_kv_in_other(pgVar14,(gguf_context *)uVar11);
        if (bVar3) {
          puts("\x1b[1;32mOK\x1b[0m");
          uVar19 = uVar19 + 1;
        }
        else {
          puts("\x1b[1;31mFAIL\x1b[0m");
        }
        printf("%s: all_orig_tensors_in_read: ","test_roundtrip");
        bVar3 = all_tensors_in_other((gguf_context *)uVar11,pgVar14);
        if (bVar3) {
          puts("\x1b[1;32mOK\x1b[0m");
          uVar19 = uVar19 + 1;
        }
        else {
          puts("\x1b[1;31mFAIL\x1b[0m");
        }
        printf("%s: all_read_tensors_in_orig: ","test_roundtrip");
        bVar3 = all_tensors_in_other(pgVar14,(gguf_context *)uVar11);
        if (bVar3) {
          puts("\x1b[1;32mOK\x1b[0m");
          uVar19 = uVar19 + 1;
        }
        else {
          puts("\x1b[1;31mFAIL\x1b[0m");
        }
        iVar5 = 7;
        if (bVar4 == false) {
          printf("%s: same_tensor_data: ","test_roundtrip");
          uVar12 = local_1408;
          lVar15 = ggml_get_first_tensor(local_1430);
          lVar8 = ggml_get_first_tensor(uVar12);
          local_1468._0_8_ = &local_1458;
          sVar13 = strlen((char *)(lVar8 + 0x100));
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_1468,(char *)(lVar8 + 0x100),lVar8 + sVar13 + 0x100);
          iVar5 = std::__cxx11::string::compare(local_1468);
          if ((gguf_context *)local_1468._0_8_ != (gguf_context *)&local_1458) {
            operator_delete((void *)local_1468._0_8_,(ulong)(local_1458 + 1));
          }
          if (iVar5 == 0) {
            lVar8 = ggml_get_next_tensor(uVar12);
            local_13f0 = uVar12;
            bVar3 = true;
            bVar4 = true;
            do {
              if (lVar15 == 0) break;
              if (lVar8 == 0) {
                bVar4 = false;
                lVar8 = 0;
                break;
              }
              __n = ggml_nbytes(lVar15);
              sVar16 = ggml_nbytes(lVar8);
              if (sVar16 == __n) {
                std::vector<char,_std::allocator<char>_>::vector
                          ((vector<char,_std::allocator<char>_> *)local_1468,__n,&local_1441);
                ggml_backend_tensor_get(lVar15,local_1468._0_8_,0,__n);
                if (__n != 0) {
                  iVar5 = bcmp((void *)local_1468._0_8_,*(void **)(lVar8 + 0xf8),__n);
                  bVar4 = bVar3;
                  if (iVar5 != 0) {
                    bVar3 = false;
                    bVar4 = false;
                  }
                }
                lVar15 = ggml_get_next_tensor(local_1430,lVar15);
                lVar8 = ggml_get_next_tensor(local_13f0);
                if ((gguf_context *)local_1468._0_8_ != (gguf_context *)0x0) {
                  operator_delete((void *)local_1468._0_8_,(long)local_1458 - local_1468._0_8_);
                }
              }
              else {
                bVar4 = false;
                bVar3 = false;
              }
            } while (sVar16 == __n);
            if ((lVar8 != 0) || (!bVar4)) goto LAB_00103da4;
            puts("\x1b[1;32mOK\x1b[0m");
            uVar19 = uVar19 + 1;
          }
          else {
LAB_00103da4:
            puts("\x1b[1;31mFAIL\x1b[0m");
          }
          iVar5 = 8;
        }
        ggml_backend_buffer_free(local_1440);
        ggml_free(local_1430);
        ggml_free(local_1408);
        gguf_free(uVar11);
        gguf_free(pgVar14);
        ggml_backend_free(local_1428);
        fclose(local_13e8);
        putchar(10);
        pgVar2 = local_1418;
        local_1410.first = local_1410.first + uVar19;
        local_1410.second = 0;
        local_1438 = (ulong)(uint)((int)local_1438 + iVar5);
        lVar8 = local_13e0 + 1;
      } while (lVar8 != 2);
      backend = (ggml_backend_t)ggml_backend_dev_init(local_1418,0);
      uVar11 = ggml_backend_dev_description(pgVar2);
      uVar12 = ggml_backend_name(backend);
      printf("%s: device=%s, backend=%s\n","test_gguf_set_kv",uVar11,uVar12);
      get_random_gguf_context((random_gguf_context_result *)local_1468,backend,(uint)local_1420);
      uVar11 = local_1468._0_8_;
      local_1430 = (ggml_backend_t)local_1468._8_8_;
      local_1428 = local_1458;
      get_random_gguf_context((random_gguf_context_result *)local_1468,backend,local_13fc);
      uVar12 = local_1468._0_8_;
      local_1440 = (ggml_backend_t)local_1468._8_8_;
      local_1418 = local_1458;
      pgVar14 = (gguf_context *)gguf_init_empty();
      gguf_set_kv(uVar12,uVar11);
      gguf_set_kv(pgVar14,uVar11);
      printf("%s: same_n_kv: ","test_gguf_set_kv");
      lVar8 = gguf_get_n_kv(uVar11);
      lVar15 = gguf_get_n_kv(pgVar14);
      pcVar18 = "\x1b[1;31mFAIL\x1b[0m";
      if (lVar8 == lVar15) {
        pcVar18 = "\x1b[1;32mOK\x1b[0m";
      }
      puts(pcVar18);
      printf("%s: all_kv_0_in_1: ","test_gguf_set_kv");
      bVar4 = all_kv_in_other((gguf_context *)uVar11,(gguf_context *)uVar12);
      if (bVar4) {
        puts("\x1b[1;32mOK\x1b[0m");
        uVar19 = (lVar8 == lVar15) + 1;
      }
      else {
        uVar19 = (uint)(lVar8 == lVar15);
        puts("\x1b[1;31mFAIL\x1b[0m");
      }
      printf("%s: all_kv_0_in_2: ","test_gguf_set_kv");
      bVar4 = all_kv_in_other((gguf_context *)uVar11,pgVar14);
      if (bVar4) {
        puts("\x1b[1;32mOK\x1b[0m");
        uVar19 = uVar19 + 1;
      }
      else {
        puts("\x1b[1;31mFAIL\x1b[0m");
      }
      gguf_set_kv(uVar11,uVar12);
      printf("%s: same_n_kv_after_double_copy: ","test_gguf_set_kv");
      lVar8 = gguf_get_n_kv(uVar11);
      lVar15 = gguf_get_n_kv(uVar12);
      if (lVar8 == lVar15) {
        puts("\x1b[1;32mOK\x1b[0m");
        uVar19 = uVar19 + 1;
      }
      else {
        puts("\x1b[1;31mFAIL\x1b[0m");
      }
      printf("%s: all_kv_1_in_0_after_double_copy: ","test_gguf_set_kv");
      bVar4 = all_kv_in_other((gguf_context *)uVar12,(gguf_context *)uVar11);
      if (bVar4) {
        puts("\x1b[1;32mOK\x1b[0m");
        uVar19 = uVar19 + 1;
      }
      else {
        puts("\x1b[1;31mFAIL\x1b[0m");
      }
      ggml_backend_buffer_free(local_1428);
      ggml_backend_buffer_free(local_1418);
      ggml_free(local_1430);
      ggml_free(local_1440);
      gguf_free(uVar11);
      gguf_free(uVar12);
      gguf_free(pgVar14);
      ggml_backend_free(backend);
      putchar(10);
      pVar9.first = local_1410.first + uVar19;
      pVar9.second = 0;
      local_1438 = (ulong)((int)local_1438 + 5);
      local_13f8 = local_13f8 + 1;
    }
    iVar5 = (int)local_1438;
    printf("%d/%d tests passed\n",(ulong)pVar9 & 0xffffffff,local_1438 & 0xffffffff);
    pcVar18 = "\x1b[1;32mOK\x1b[0m";
    if (pVar9.first != iVar5) {
      pcVar18 = "\x1b[1;31mFAIL\x1b[0m";
    }
    puts(pcVar18);
    std::random_device::_M_fini();
    uVar19 = (uint)(pVar9.first != iVar5);
  }
  else {
    puts("usage: test-gguf [seed]");
    puts("  if no seed is unspecified then a random seed is used");
    uVar19 = 1;
  }
  return uVar19;
}

Assistant:

int main(int argc, char ** argv) {
    if (argc > 2) {
        print_usage();
        return 1;
    }

    std::random_device rd;
    const unsigned int seed = argc < 2 ? rd() : std::stoi(argv[1]);

    // Initialize ggml backends early so the prints aren't interleaved with the test results:
    ggml_backend_dev_count();
    fprintf(stderr, "\n");

    int npass = 0;
    int ntest = 0;
    {
        std::pair<int, int> result = test_handcrafted_file(seed);
        npass += result.first;
        ntest += result.second;
    }

    for (size_t i = 0; i < ggml_backend_dev_count(); ++i) {
        ggml_backend_dev_t dev = ggml_backend_dev_get(i);

        for (bool only_meta : {true, false}) {
            std::pair<int, int> result = test_roundtrip(dev, seed, only_meta);
            npass += result.first;
            ntest += result.second;
        }

        {
            std::pair<int, int> result = test_gguf_set_kv(dev, seed);
            npass += result.first;
            ntest += result.second;
        }
    }

    printf("%d/%d tests passed\n", npass, ntest);
    if (npass != ntest) {
        printf("\033[1;31mFAIL\033[0m\n");
        return 1;
    }
    printf("\033[1;32mOK\033[0m\n");
    return 0;
}